

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O1

dtl_dv_t * dtl_json_load(FILE *fh)

{
  int iVar1;
  dtl_dv_t *pdVar2;
  dtl_json_reader_t reader;
  ifstream_handler_t handler;
  ifstream_t ifstream;
  dtl_json_reader_t local_c0;
  dtl_json_reader_t *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  undefined1 local_30 [32];
  
  dtl_json_reader_create(&local_c0);
  uStack_50 = 0;
  pcStack_40 = dtl_json_reader_readChunk;
  local_48 = dtl_json_reader_close;
  local_58 = &local_c0;
  ifstream_create(local_30);
  iVar1 = ifstream_readTextFileFromHandle(local_30,fh);
  if (((iVar1 == 0) && (local_c0.parseComplete == true)) &&
     (pdVar2 = (local_c0.data)->currentElem, pdVar2 != (dtl_dv_t *)0x0)) {
    dtl_dv_inc_ref(pdVar2);
  }
  else {
    pdVar2 = (dtl_dv_t *)0x0;
  }
  dtl_json_reader_destroy(&local_c0);
  return pdVar2;
}

Assistant:

dtl_dv_t* dtl_json_load(FILE *fh)
{
   dtl_dv_t *retval = (dtl_dv_t*) 0;
   ifstream_handler_t handler;
   ifstream_t ifstream;
   dtl_json_reader_t reader;
   dtl_json_reader_create(&reader);
   memset(&handler, 0, sizeof(handler));
   handler.arg = (void*) &reader;
   handler.write = dtl_json_reader_readChunk;
   handler.close = dtl_json_reader_close;
   ifstream_create(&ifstream, &handler);
   if (ifstream_readTextFileFromHandle(&ifstream, fh) == 0)
   {
      if ( (reader.parseComplete) && (reader.data->currentElem != 0) )
      {
         retval = reader.data->currentElem;
         dtl_dv_inc_ref(reader.data->currentElem);
      }
      dtl_json_reader_destroy(&reader);
   }
   else
   {
      dtl_json_reader_destroy(&reader);
   }
   return retval;
}